

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_bool32 ma_dr_flac_oggbs__seek_physical
                    (ma_dr_flac_oggbs *oggbs,ma_uint64 offset,ma_dr_flac_seek_origin origin)

{
  ma_bool32 mVar1;
  bool bVar2;
  
  bVar2 = origin == ma_dr_flac_seek_origin_start;
  while (bVar2) {
    if (offset < 0x80000000) {
      mVar1 = (*oggbs->onSeek)(oggbs->pUserData,(int)offset,ma_dr_flac_seek_origin_start);
      if (mVar1 == 0) {
        return 0;
      }
      goto LAB_0017d7da;
    }
    mVar1 = (*oggbs->onSeek)(oggbs->pUserData,0x7fffffff,ma_dr_flac_seek_origin_start);
    if (mVar1 == 0) {
      return 0;
    }
    oggbs->currentBytePos = offset;
    offset = offset - 0x7fffffff;
    bVar2 = false;
  }
  while( true ) {
    if (offset >> 0x1f == 0) break;
    mVar1 = (*oggbs->onSeek)(oggbs->pUserData,0x7fffffff,ma_dr_flac_seek_origin_current);
    if (mVar1 == 0) goto LAB_0017d7e3;
    oggbs->currentBytePos = oggbs->currentBytePos + 0x7fffffff;
    offset = offset - 0x7fffffff;
  }
  mVar1 = (*oggbs->onSeek)(oggbs->pUserData,(int)offset,ma_dr_flac_seek_origin_current);
  if (mVar1 == 0) {
LAB_0017d7e3:
    mVar1 = 0;
  }
  else {
    offset = offset + oggbs->currentBytePos;
LAB_0017d7da:
    oggbs->currentBytePos = offset;
    mVar1 = 1;
  }
  return mVar1;
}

Assistant:

static ma_bool32 ma_dr_flac_oggbs__seek_physical(ma_dr_flac_oggbs* oggbs, ma_uint64 offset, ma_dr_flac_seek_origin origin)
{
    if (origin == ma_dr_flac_seek_origin_start) {
        if (offset <= 0x7FFFFFFF) {
            if (!oggbs->onSeek(oggbs->pUserData, (int)offset, ma_dr_flac_seek_origin_start)) {
                return MA_FALSE;
            }
            oggbs->currentBytePos = offset;
            return MA_TRUE;
        } else {
            if (!oggbs->onSeek(oggbs->pUserData, 0x7FFFFFFF, ma_dr_flac_seek_origin_start)) {
                return MA_FALSE;
            }
            oggbs->currentBytePos = offset;
            return ma_dr_flac_oggbs__seek_physical(oggbs, offset - 0x7FFFFFFF, ma_dr_flac_seek_origin_current);
        }
    } else {
        while (offset > 0x7FFFFFFF) {
            if (!oggbs->onSeek(oggbs->pUserData, 0x7FFFFFFF, ma_dr_flac_seek_origin_current)) {
                return MA_FALSE;
            }
            oggbs->currentBytePos += 0x7FFFFFFF;
            offset -= 0x7FFFFFFF;
        }
        if (!oggbs->onSeek(oggbs->pUserData, (int)offset, ma_dr_flac_seek_origin_current)) {
            return MA_FALSE;
        }
        oggbs->currentBytePos += offset;
        return MA_TRUE;
    }
}